

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlcdnumber.cpp
# Opt level: O0

void __thiscall QLCDNumber::paintEvent(QLCDNumber *this,QPaintEvent *param_2)

{
  QLCDNumberPrivate *this_00;
  qreal in_RSI;
  QPainter *in_RDI;
  long in_FS_OFFSET;
  QLCDNumberPrivate *d;
  QPainter p;
  bool in_stack_00000037;
  QBitArray *in_stack_00000038;
  QPainter *in_stack_00000040;
  QString *in_stack_00000048;
  QLCDNumberPrivate *in_stack_00000050;
  QPainter *this_01;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = in_RDI;
  this_00 = d_func((QLCDNumber *)0x5bb07f);
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  QPainter::QPainter((QPainter *)&local_10,(QPaintDevice *)(in_RDI + 0x10));
  QFrame::drawFrame((QFrame *)this_00,in_RDI);
  QPainter::setRenderHint((RenderHint)&local_10,true);
  if (((byte)this_00->field_0x288 >> 4 & 1) != 0) {
    QPainter::translate(this_01,in_RSI,(qreal)this_00);
  }
  if (((byte)this_00->field_0x288 >> 2 & 1) == 0) {
    QLCDNumberPrivate::drawString
              (in_stack_00000050,in_stack_00000048,in_stack_00000040,in_stack_00000038,
               in_stack_00000037);
  }
  else {
    QLCDNumberPrivate::drawString
              (in_stack_00000050,in_stack_00000048,in_stack_00000040,in_stack_00000038,
               in_stack_00000037);
  }
  QPainter::~QPainter((QPainter *)&local_10);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QLCDNumber::paintEvent(QPaintEvent *)
{
    Q_D(QLCDNumber);
    QPainter p(this);
    drawFrame(&p);
    p.setRenderHint(QPainter::Antialiasing);
    if (d->shadow)
        p.translate(0.5, 0.5);

    if (d->smallPoint)
        d->drawString(d->digitStr, p, &d->points, false);
    else
        d->drawString(d->digitStr, p, nullptr, false);
}